

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O3

string * __thiscall
diligent_spirv_cross::
join<char_const(&)[2],diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>&,char_const(&)[6],char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
          (string *__return_storage_ptr__,diligent_spirv_cross *this,char (*ts) [2],
          TypedID<(diligent_spirv_cross::Types)2> *ts_1,char (*ts_2) [6],char (*ts_3) [4],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_4,char (*ts_5) [2])

{
  StringStream<4096UL,_4096UL> stream;
  undefined1 local_1128 [4344];
  
  local_1128._4120_8_ = local_1128 + 0x1030;
  local_1128._16_8_ = 0;
  local_1128._0_8_ = (char *)0x0;
  local_1128._8_8_ = 0;
  local_1128._4128_8_ = 0;
  local_1128._4136_8_ = 8;
  StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1128);
  inner::
  join_helper<char_const(&)[2],diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>&,char_const(&)[6],char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
            ((StringStream<4096UL,_4096UL> *)local_1128,(char (*) [2])this,
             (TypedID<(diligent_spirv_cross::Types)2> *)ts,(char (*) [6])ts_1,(char (*) [4])ts_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_3,
             (char (*) [2])ts_4);
  StringStream<4096ul,4096ul>::str_abi_cxx11_(__return_storage_ptr__,local_1128);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}